

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O0

Msat_IntVec_t * Msat_IntVecDup(Msat_IntVec_t *pVec)

{
  Msat_IntVec_t *pMVar1;
  int *local_20;
  Msat_IntVec_t *p;
  Msat_IntVec_t *pVec_local;
  
  pMVar1 = (Msat_IntVec_t *)malloc(0x10);
  pMVar1->nSize = pVec->nSize;
  pMVar1->nCap = pVec->nCap;
  if (pMVar1->nCap == 0) {
    local_20 = (int *)0x0;
  }
  else {
    local_20 = (int *)malloc((long)pMVar1->nCap << 2);
  }
  pMVar1->pArray = local_20;
  memcpy(pMVar1->pArray,pVec->pArray,(long)pVec->nSize << 2);
  return pMVar1;
}

Assistant:

Msat_IntVec_t * Msat_IntVecDup( Msat_IntVec_t * pVec )
{
    Msat_IntVec_t * p;
    p = ABC_ALLOC( Msat_IntVec_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = p->nCap? ABC_ALLOC( int, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(int) * pVec->nSize );
    return p;
}